

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O2

bool __thiscall
Am_Gesture_Trainer::Add_Class(Am_Gesture_Trainer *this,Am_String *classname,bool unique)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Gesture_Trainer_Data *pAVar2;
  Gesture_Class *pGVar3;
  Am_String AStack_38;
  Am_String local_30;
  
  pAVar2 = this->data;
  if (pAVar2 == (Am_Gesture_Trainer_Data *)0x0) {
    pAVar2 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(pAVar2);
  }
  else {
    if (!unique) goto LAB_001b14f9;
    iVar1 = (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                      (pAVar2);
    pAVar2 = (Am_Gesture_Trainer_Data *)CONCAT44(extraout_var,iVar1);
  }
  this->data = pAVar2;
LAB_001b14f9:
  Am_String::Am_String(&local_30,classname);
  pGVar3 = Am_Gesture_Trainer_Data::Find_Class(pAVar2,&local_30);
  Am_String::~Am_String(&local_30);
  if (pGVar3 == (Gesture_Class *)0x0) {
    pAVar2 = this->data;
    Am_String::Am_String(&AStack_38,classname);
    Am_Gesture_Trainer_Data::Add_Class(pAVar2,&AStack_38);
    Am_String::~Am_String(&AStack_38);
    Am_Gesture_Classifier::operator=
              (&this->data->cached_classifier,(Am_Gesture_Classifier_Data *)0x0);
  }
  return pGVar3 == (Gesture_Class *)0x0;
}

Assistant:

bool
Am_Gesture_Trainer::Add_Class(Am_String classname, bool unique)
{
  if (!data)
    data = new Am_Gesture_Trainer_Data();
  else if (unique)
    data = (Am_Gesture_Trainer_Data *)data->Make_Unique();

  if (data->Find_Class(classname))
    return false; // class already exists

  data->Add_Class(classname);

  data->cached_classifier = nullptr;
  return true;
}